

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int export_tls12_params(ptls_buffer_t *output,int is_server,int session_reused,
                       ptls_cipher_suite_t *cipher,void *client_random,char *server_name,
                       ptls_iovec_t negotiated_protocol,void *enc_key,void *enc_iv,uint64_t enc_seq,
                       uint64_t enc_record_iv,void *dec_key,void *dec_iv,uint64_t dec_seq)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  size_t local_140;
  size_t body_size;
  size_t body_size_4;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  uint64_t local_e0;
  uint64_t _v_4;
  uint64_t local_d0;
  uint64_t _v_3;
  uint64_t local_c0;
  uint64_t _v_2;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t len;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t local_68;
  undefined1 local_66;
  undefined1 local_65;
  undefined2 local_64;
  undefined1 local_62;
  undefined1 local_61;
  uint16_t _v_1;
  uint16_t _v;
  size_t body_start;
  size_t capacity;
  ptls_iovec_t _negotiated_protocol;
  char *_server_name;
  int ret;
  char *server_name_local;
  void *client_random_local;
  ptls_cipher_suite_t *cipher_local;
  int session_reused_local;
  int is_server_local;
  ptls_buffer_t *output_local;
  
  capacity = (size_t)negotiated_protocol.base;
  _negotiated_protocol.base = (uint8_t *)negotiated_protocol.len;
  body_start = 2;
  _negotiated_protocol.len = (size_t)server_name;
  _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
  if (_server_name._4_4_ == 0) {
    __v_1 = output->off;
    local_61 = (undefined1)is_server;
    _server_name._4_4_ = ptls_buffer__do_pushv(output,&local_61,1);
    if (_server_name._4_4_ == 0) {
      local_62 = (undefined1)session_reused;
      _server_name._4_4_ = ptls_buffer__do_pushv(output,&local_62,1);
      if (_server_name._4_4_ == 0) {
        local_64 = 0x303;
        local_66 = 3;
        local_65 = 3;
        _server_name._4_4_ = ptls_buffer__do_pushv(output,&local_66,2);
        if (_server_name._4_4_ == 0) {
          local_68 = cipher->id;
          capacity_1._6_1_ = (undefined1)(local_68 >> 8);
          capacity_1._7_1_ = (undefined1)local_68;
          _server_name._4_4_ = ptls_buffer__do_pushv(output,(void *)((long)&capacity_1 + 6),2);
          if ((_server_name._4_4_ == 0) &&
             (_server_name._4_4_ = ptls_buffer__do_pushv(output,client_random,0x20),
             _server_name._4_4_ == 0)) {
            body_start_1 = 2;
            _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
            if (_server_name._4_4_ == 0) {
              len = output->off;
              if (_negotiated_protocol.len == 0) {
                local_140 = 0;
              }
              else {
                local_140 = strlen((char *)_negotiated_protocol.len);
              }
              body_size_1 = local_140;
              _server_name._4_4_ =
                   ptls_buffer__do_pushv(output,(void *)_negotiated_protocol.len,local_140);
              if (_server_name._4_4_ == 0) {
                capacity_2 = output->off - len;
                if (body_start_1 == 0xffffffffffffffff) {
                  iVar2 = ptls_buffer__adjust_quic_blocksize(output,capacity_2);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                }
                else {
                  if ((body_start_1 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= capacity_2)) {
                    return 0x20c;
                  }
                  for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                    output->base[len - body_start_1] =
                         (uint8_t)(capacity_2 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                  }
                }
                body_start_2 = 2;
                _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
                if (_server_name._4_4_ == 0) {
                  body_size_2 = output->off;
                  _server_name._4_4_ =
                       ptls_buffer__do_pushv
                                 (output,(void *)capacity,(size_t)_negotiated_protocol.base);
                  if (_server_name._4_4_ == 0) {
                    capacity_3 = output->off - body_size_2;
                    if (body_start_2 == 0xffffffffffffffff) {
                      iVar2 = ptls_buffer__adjust_quic_blocksize(output,capacity_3);
                      if (iVar2 != 0) {
                        return iVar2;
                      }
                    }
                    else {
                      if ((body_start_2 < 8) &&
                         ((ulong)(1L << ((byte)(body_start_2 << 3) & 0x3f)) <= capacity_3)) {
                        return 0x20c;
                      }
                      for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                        output->base[body_size_2 - body_start_2] =
                             (uint8_t)(capacity_3 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
                      }
                    }
                    body_start_3 = 2;
                    _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
                    if (_server_name._4_4_ == 0) {
                      _v_2 = output->off;
                      _server_name._4_4_ =
                           ptls_buffer__do_pushv(output,enc_key,cipher->aead->key_size);
                      if ((_server_name._4_4_ == 0) &&
                         (_server_name._4_4_ =
                               ptls_buffer__do_pushv
                                         (output,enc_iv,(cipher->aead->tls12).fixed_iv_size),
                         _server_name._4_4_ == 0)) {
                        local_c0 = enc_seq;
                        _v_3._0_1_ = (undefined1)(enc_seq >> 0x38);
                        _v_3._1_1_ = (undefined1)(enc_seq >> 0x30);
                        _v_3._2_1_ = (undefined1)(enc_seq >> 0x28);
                        _v_3._3_1_ = (undefined1)(enc_seq >> 0x20);
                        _v_3._4_1_ = (undefined1)(enc_seq >> 0x18);
                        _v_3._5_1_ = (undefined1)(enc_seq >> 0x10);
                        _v_3._6_1_ = (undefined1)(enc_seq >> 8);
                        _v_3._7_1_ = (undefined1)enc_seq;
                        _server_name._4_4_ = ptls_buffer__do_pushv(output,&_v_3,8);
                        if (_server_name._4_4_ == 0) {
                          if ((cipher->aead->tls12).record_iv_size != 0) {
                            local_d0 = enc_record_iv;
                            _v_4._0_1_ = (undefined1)(enc_record_iv >> 0x38);
                            _v_4._1_1_ = (undefined1)(enc_record_iv >> 0x30);
                            _v_4._2_1_ = (undefined1)(enc_record_iv >> 0x28);
                            _v_4._3_1_ = (undefined1)(enc_record_iv >> 0x20);
                            _v_4._4_1_ = (undefined1)(enc_record_iv >> 0x18);
                            _v_4._5_1_ = (undefined1)(enc_record_iv >> 0x10);
                            _v_4._6_1_ = (undefined1)(enc_record_iv >> 8);
                            _v_4._7_1_ = (undefined1)enc_record_iv;
                            iVar2 = ptls_buffer__do_pushv(output,&_v_4,8);
                            if (iVar2 != 0) {
                              return iVar2;
                            }
                          }
                          _server_name._4_4_ =
                               ptls_buffer__do_pushv(output,dec_key,cipher->aead->key_size);
                          if ((_server_name._4_4_ == 0) &&
                             (_server_name._4_4_ =
                                   ptls_buffer__do_pushv
                                             (output,dec_iv,(cipher->aead->tls12).fixed_iv_size),
                             _server_name._4_4_ == 0)) {
                            local_e0 = dec_seq;
                            body_size_3._0_1_ = (undefined1)(dec_seq >> 0x38);
                            body_size_3._1_1_ = (undefined1)(dec_seq >> 0x30);
                            body_size_3._2_1_ = (undefined1)(dec_seq >> 0x28);
                            body_size_3._3_1_ = (undefined1)(dec_seq >> 0x20);
                            body_size_3._4_1_ = (undefined1)(dec_seq >> 0x18);
                            body_size_3._5_1_ = (undefined1)(dec_seq >> 0x10);
                            body_size_3._6_1_ = (undefined1)(dec_seq >> 8);
                            body_size_3._7_1_ = (undefined1)dec_seq;
                            _server_name._4_4_ = ptls_buffer__do_pushv(output,&body_size_3,8);
                            if (_server_name._4_4_ == 0) {
                              uVar3 = output->off - _v_2;
                              if (body_start_3 == 0xffffffffffffffff) {
                                iVar2 = ptls_buffer__adjust_quic_blocksize(output,uVar3);
                                if (iVar2 != 0) {
                                  return iVar2;
                                }
                              }
                              else {
                                if ((body_start_3 < 8) &&
                                   ((ulong)(1L << ((byte)(body_start_3 << 3) & 0x3f)) <= uVar3)) {
                                  return 0x20c;
                                }
                                for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
                                  output->base[_v_2 - body_start_3] =
                                       (uint8_t)(uVar3 >> (((char)body_start_3 + -1) * '\b' & 0x3fU)
                                                );
                                }
                              }
                              body_start_4 = 2;
                              _server_name._4_4_ = ptls_buffer__do_pushv(output,"",2);
                              if (_server_name._4_4_ == 0) {
                                sVar1 = output->off;
                                uVar3 = output->off - sVar1;
                                if (uVar3 < 0x10000) {
                                  for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                                    output->base[sVar1 - body_start_4] =
                                         (uint8_t)(uVar3 >> (((char)body_start_4 + -1) * '\b' &
                                                            0x3fU));
                                  }
                                  uVar3 = output->off - __v_1;
                                  if (body_start == 0xffffffffffffffff) {
                                    iVar2 = ptls_buffer__adjust_quic_blocksize(output,uVar3);
                                    if (iVar2 != 0) {
                                      return iVar2;
                                    }
                                  }
                                  else {
                                    if ((body_start < 8) &&
                                       ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= uVar3)) {
                                      return 0x20c;
                                    }
                                    for (; body_start != 0; body_start = body_start - 1) {
                                      output->base[__v_1 - body_start] =
                                           (uint8_t)(uVar3 >> (((char)body_start + -1) * '\b' &
                                                              0x3fU));
                                    }
                                  }
                                  _server_name._4_4_ = 0;
                                }
                                else {
                                  _server_name._4_4_ = 0x20c;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _server_name._4_4_;
}

Assistant:

int export_tls12_params(ptls_buffer_t *output, int is_server, int session_reused, ptls_cipher_suite_t *cipher,
                               const void *client_random, const char *server_name, ptls_iovec_t negotiated_protocol,
                               const void *enc_key, const void *enc_iv, uint64_t enc_seq, uint64_t enc_record_iv,
                               const void *dec_key, const void *dec_iv, uint64_t dec_seq)
{
    int ret;

    export_tls_params(output, is_server, session_reused, PTLS_PROTOCOL_VERSION_TLS12, cipher, client_random, server_name,
                      negotiated_protocol, {
                          ptls_buffer_pushv(output, enc_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, enc_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, enc_seq);
                          if (cipher->aead->tls12.record_iv_size != 0)
                              ptls_buffer_push64(output, enc_record_iv);
                          ptls_buffer_pushv(output, dec_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, dec_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, dec_seq);
                      });
    ret = 0;

Exit:
    return ret;
}